

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

CharClass * __thiscall re2::CharClassBuilder::GetCharClass(CharClassBuilder *this)

{
  _Rb_tree_header *p_Var1;
  CharClass *pCVar2;
  _Rb_tree_node_base *p_Var3;
  long lVar4;
  
  pCVar2 = (CharClass *)
           operator_new__((long)(int)(this->ranges_)._M_t._M_impl.super__Rb_tree_header.
                                     _M_node_count * 8 + 0x18);
  *(CharClass **)(pCVar2 + 8) = pCVar2 + 0x18;
  lVar4 = 0;
  *(undefined4 *)(pCVar2 + 0x10) = 0;
  *pCVar2 = (CharClass)0x0;
  *(undefined4 *)(pCVar2 + 4) = 0;
  p_Var3 = (this->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->ranges_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    lVar4 = 0;
    do {
      *(undefined8 *)(*(long *)(pCVar2 + 8) + lVar4 * 8) = *(undefined8 *)(p_Var3 + 1);
      lVar4 = lVar4 + 1;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  *(int *)(pCVar2 + 0x10) = (int)lVar4;
  if ((int)lVar4 <= (int)(this->ranges_)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    *(int *)(pCVar2 + 4) = this->nrunes_;
    *pCVar2 = (CharClass)(((this->lower_ ^ this->upper_) & 0x3ffffff) == 0);
    return pCVar2;
  }
  __assert_fail("(n) <= (static_cast<int>(ranges_.size()))",
                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.cc",
                0x3a1,"CharClass *re2::CharClassBuilder::GetCharClass()");
}

Assistant:

CharClass* CharClassBuilder::GetCharClass() {
  CharClass* cc = CharClass::New(static_cast<int>(ranges_.size()));
  int n = 0;
  for (iterator it = begin(); it != end(); ++it)
    cc->ranges_[n++] = *it;
  cc->nranges_ = n;
  DCHECK_LE(n, static_cast<int>(ranges_.size()));
  cc->nrunes_ = nrunes_;
  cc->folds_ascii_ = FoldsASCII();
  return cc;
}